

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computationTest.cpp
# Opt level: O3

void __thiscall Computation_FG_Test::TestBody(Computation_FG_Test *this)

{
  lattice *grid;
  uint uVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  double **F;
  double **ppdVar5;
  double **RHS;
  char *pcVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  AssertionResult gtest_ar;
  double errRHS;
  double errG;
  double errF;
  double init [3];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  double **local_c8;
  double **local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  char **local_a0;
  double local_98 [4];
  fluidSim local_78;
  
  local_98[0] = 0.773;
  local_98[1] = 14.567;
  local_98[2] = 0.0;
  grid = &(this->super_Computation).grid;
  initUVP(&(this->super_Computation).U,&(this->super_Computation).V,&(this->super_Computation).P,
          (this->super_Computation).grid.deli,(this->super_Computation).grid.delj,local_98);
  F = create2Dfield((this->super_Computation).grid.deli + 1,(this->super_Computation).grid.delj + 1)
  ;
  ppdVar5 = create2Dfield((this->super_Computation).grid.deli + 1,
                          (this->super_Computation).grid.delj + 1);
  RHS = create2Dfield((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  local_a0 = create2DIntegerField
                       ((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  local_78.Re = 1000.0;
  local_78.alpha = 0.0;
  local_78.GX = 0.0;
  local_78.GY = 0.0;
  compFG((this->super_Computation).U,(this->super_Computation).V,F,ppdVar5,local_a0,0.5,grid,
         &local_78);
  local_c8 = RHS;
  local_c0 = ppdVar5;
  compRHS(F,ppdVar5,RHS,grid,0.5);
  local_a8 = 0.0;
  local_b0 = 0.0;
  local_b8 = 0.0;
  uVar1 = (this->super_Computation).grid.deli;
  ppdVar5 = (this->super_Computation).U;
  if (0 < (int)uVar1) {
    iVar2 = (this->super_Computation).grid.delj;
    dVar3 = 0.0;
    lVar7 = 1;
    dVar9 = 0.0;
    dVar10 = 0.0;
    do {
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          dVar11 = F[lVar7 + -1][lVar8 + 1] - ppdVar5[lVar7][lVar8 + 1];
          dVar3 = dVar3 + dVar11 * dVar11;
          dVar11 = local_c0[lVar7][lVar8] - (this->super_Computation).V[lVar7][lVar8 + 1];
          dVar9 = dVar9 + dVar11 * dVar11;
          dVar10 = dVar10 + local_c8[lVar7 + -1][lVar8] * local_c8[lVar7 + -1][lVar8];
          lVar8 = lVar8 + 1;
          local_b8 = dVar10;
          local_b0 = dVar9;
          local_a8 = dVar3;
        } while ((ulong)(iVar2 + 1) - 1 != lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != (ulong)uVar1 + 1);
  }
  destroy2Dfield(ppdVar5,uVar1 + 3);
  destroy2Dfield((this->super_Computation).V,(this->super_Computation).grid.deli + 2);
  destroy2Dfield((this->super_Computation).P,(this->super_Computation).grid.deli + 2);
  destroy2Dfield(F,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(local_c0,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(local_c8,(this->super_Computation).grid.deli);
  destroy2Dfield(local_a0,(this->super_Computation).grid.deli + 2);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errF","1e-4",&local_a8,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errG","1e-4",&local_b0,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errRHS","1e-4",&local_b8,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(Computation, FG)
{
	REAL init[3] = {0.773,14.567,0};
	initUVP(&U,&V,&P,grid.deli,grid.delj,init);
	REAL **F = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **G = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **rhs = create2Dfield(grid.deli,grid.delj);
	char **FLAG = create2DIntegerField(grid.deli,grid.delj);

	fluidSim sim;
	sim.Re = 1000;
	sim.GX = 0;
	sim.GY = 0;
	sim.alpha = 0;
	compFG(U,V,F,G,FLAG,0.5,&grid,&sim);
	compRHS(F,G,rhs,&grid,0.5);
	REAL errF = 0, errG = 0, errRHS = 0;
	for (int i = 1; i <= grid.deli; i++)
		for (int j = 1; j <= grid.delj; j++)
		{
			errF += sqr(F[i-1][j] - U[i][j]);
			errG += sqr(G[i][j-1] - V[i][j]);
			errRHS += sqr(rhs[i-1][j-1]);
		}

	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	destroy2Dfield((void**)F,grid.deli+1);
	destroy2Dfield((void**)G,grid.deli+1);
	destroy2Dfield((void**)rhs,grid.deli);
	destroy2Dfield((void**)FLAG,grid.deli+2);

	EXPECT_LE(errF,1e-4);
	EXPECT_LE(errG,1e-4);
	EXPECT_LE(errRHS,1e-4);
}